

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp_world.cpp
# Opt level: O3

State * __thiscall despot::POMDPWorld::Initialize(POMDPWorld *this)

{
  DSPOMDP *pDVar1;
  int iVar2;
  undefined4 extraout_var;
  long *local_40 [2];
  long local_30 [2];
  State *pSVar3;
  
  pDVar1 = this->model_;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"DEFAULT","");
  iVar2 = (*pDVar1->_vptr_DSPOMDP[8])(pDVar1,(string *)local_40);
  pSVar3 = (State *)CONCAT44(extraout_var,iVar2);
  (this->super_World).state_ = pSVar3;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
    pSVar3 = (this->super_World).state_;
  }
  return pSVar3;
}

Assistant:

State* POMDPWorld::Initialize() {
	state_ = model_->CreateStartState();
	return state_;
}